

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_BigDiamond_Test::TestBody(SCCTest_BigDiamond_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_03;
  bool bVar1;
  char *message;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_268;
  AssertHelper local_210;
  Message local_208;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_1fd;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_1fc;
  undefined1 local_1fb;
  allocator<unsigned_int> local_1fa;
  less<unsigned_int> local_1f9;
  uint local_1f8 [2];
  iterator local_1f0;
  size_type local_1e8;
  allocator<unsigned_int> local_1da;
  less<unsigned_int> local_1d9;
  uint local_1d8 [2];
  iterator local_1d0;
  size_type local_1c8;
  allocator<unsigned_int> local_1ba;
  less<unsigned_int> local_1b9;
  uint local_1b8 [2];
  iterator local_1b0;
  size_type local_1a8;
  allocator<unsigned_int> local_19a;
  less<unsigned_int> local_199;
  uint local_198 [2];
  iterator local_190;
  size_type local_188;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_180;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_178;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_148;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_118;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  iterator local_b8;
  size_type local_b0;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  SCCSet local_78;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_BigDiamond_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,8);
  Graph::addEdge((Graph *)local_28,0,1);
  Graph::addEdge((Graph *)local_28,1,0);
  Graph::addEdge((Graph *)local_28,2,3);
  Graph::addEdge((Graph *)local_28,3,2);
  Graph::addEdge((Graph *)local_28,4,5);
  Graph::addEdge((Graph *)local_28,5,4);
  Graph::addEdge((Graph *)local_28,6,7);
  Graph::addEdge((Graph *)local_28,7,6);
  Graph::addEdge((Graph *)local_28,2,0);
  Graph::addEdge((Graph *)local_28,2,4);
  Graph::addEdge((Graph *)local_28,0,6);
  Graph::addEdge((Graph *)local_28,4,6);
  getSCCs(&local_78,(Graph_conflict1 *)local_28);
  local_1fb = 1;
  local_198[0] = 0;
  local_198[1] = 1;
  local_190 = local_198;
  local_188 = 2;
  local_180 = &local_178;
  std::allocator<unsigned_int>::allocator(&local_19a);
  __l_02._M_len = local_188;
  __l_02._M_array = local_190;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_178,__l_02,&local_199,&local_19a);
  local_1b8[0] = 2;
  local_1b8[1] = 3;
  local_1b0 = local_1b8;
  local_1a8 = 2;
  local_180 = &local_148;
  std::allocator<unsigned_int>::allocator(&local_1ba);
  __l_01._M_len = local_1a8;
  __l_01._M_array = local_1b0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_148,__l_01,&local_1b9,&local_1ba);
  local_1d8[0] = 4;
  local_1d8[1] = 5;
  local_1d0 = local_1d8;
  local_1c8 = 2;
  local_180 = &local_118;
  std::allocator<unsigned_int>::allocator(&local_1da);
  __l_00._M_len = local_1c8;
  __l_00._M_array = local_1d0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_118,__l_00,&local_1d9,&local_1da);
  local_1f8[0] = 6;
  local_1f8[1] = 7;
  local_1f0 = local_1f8;
  local_1e8 = 2;
  local_180 = &local_e8;
  std::allocator<unsigned_int>::allocator(&local_1fa);
  __l._M_len = local_1e8;
  __l._M_array = local_1f0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_e8,__l,&local_1f9,&local_1fa);
  local_1fb = 0;
  local_b8 = &local_178;
  local_b0 = 4;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_1fd);
  __l_03._M_len = local_b0;
  __l_03._M_array = local_b8;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set(&local_a8,__l_03,&local_1fc,&local_1fd);
  testing::internal::EqHelper::
  Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_48,"getSCCs(graph)","(SCCSet{{0, 1}, {2, 3}, {4, 5}, {6, 7}})",
             &local_78,&local_a8);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_a8);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_1fd);
  local_268 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_b8
  ;
  do {
    local_268 = local_268 + -1;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(local_268);
  } while (local_268 != &local_178);
  std::allocator<unsigned_int>::~allocator(&local_1fa);
  std::allocator<unsigned_int>::~allocator(&local_1da);
  std::allocator<unsigned_int>::~allocator(&local_1ba);
  std::allocator<unsigned_int>::~allocator(&local_19a);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x136,message);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, BigDiamond) {
  // 67 <- 01 <- 23 -> 45 -> 67
  Graph graph(8);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);

  graph.addEdge(2, 3);
  graph.addEdge(3, 2);

  graph.addEdge(4, 5);
  graph.addEdge(5, 4);

  graph.addEdge(6, 7);
  graph.addEdge(7, 6);

  graph.addEdge(2, 0);
  graph.addEdge(2, 4);
  graph.addEdge(0, 6);
  graph.addEdge(4, 6);

  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1}, {2, 3}, {4, 5}, {6, 7}}));
}